

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptorProto::~EnumValueDescriptorProto
          (EnumValueDescriptorProto *this)

{
  ~EnumValueDescriptorProto(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

EnumValueDescriptorProto::~EnumValueDescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.EnumValueDescriptorProto)
  SharedDtor(*this);
}